

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreewidget.cpp
# Opt level: O0

bool __thiscall QTreeModel::insertRows(QTreeModel *this,int row,int count,QModelIndex *parent)

{
  int iVar1;
  QTreeWidgetItem *pQVar2;
  QTreeWidgetItem *this_00;
  QTreeWidget *pQVar3;
  QModelIndex *in_RCX;
  int in_EDX;
  int in_ESI;
  parameter_type in_RDI;
  long in_FS_OFFSET;
  QTreeWidgetItem *item;
  QTreeWidgetItem *par;
  SkipSorting skipSorting;
  QTreeModel *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff84;
  QTreeWidgetItem *this_01;
  int local_30;
  bool local_19;
  undefined1 local_18 [16];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_18._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  SkipSorting::SkipSorting((SkipSorting *)local_18,(QTreeModel *)in_RDI);
  if ((0 < in_EDX) && (-1 < in_ESI)) {
    iVar1 = (**(code **)(*(long *)&in_RDI->_vptr_QTreeWidgetItem + 0x78))(in_RDI,in_RCX);
    if (in_ESI <= iVar1) {
      iVar1 = QModelIndex::column(in_RCX);
      if (iVar1 < 1) {
        QAbstractItemModel::beginInsertRows((QModelIndex *)in_RDI,(int)in_RCX,in_ESI);
        pQVar2 = QTreeModel::item(in_stack_ffffffffffffff78,(QModelIndex *)0x90f6c8);
        for (local_30 = in_EDX; 0 < local_30; local_30 = local_30 + -1) {
          this_00 = (QTreeWidgetItem *)operator_new(0x60);
          QTreeWidgetItem::QTreeWidgetItem(this_00,in_stack_ffffffffffffff84);
          this_01 = this_00;
          pQVar3 = view((QTreeModel *)0x90f705);
          this_00->view = pQVar3;
          this_00->par = pQVar2;
          if (pQVar2 == (QTreeWidgetItem *)0x0) {
            QList<QTreeWidgetItem_*>::insert
                      ((QList<QTreeWidgetItem_*> *)this_01,
                       CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),in_RDI);
          }
          else {
            QList<QTreeWidgetItem_*>::insert
                      ((QList<QTreeWidgetItem_*> *)this_01,
                       CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),in_RDI);
          }
        }
        QAbstractItemModel::endInsertRows();
        local_19 = true;
        goto LAB_0090f7a4;
      }
    }
  }
  local_19 = false;
LAB_0090f7a4:
  SkipSorting::~SkipSorting((SkipSorting *)local_18);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_19;
  }
  __stack_chk_fail();
}

Assistant:

bool QTreeModel::insertRows(int row, int count, const QModelIndex &parent)
{
    SkipSorting skipSorting(this);
    if (count < 1 || row < 0 || row > rowCount(parent) || parent.column() > 0)
        return false;

    beginInsertRows(parent, row, row + count - 1);
    QTreeWidgetItem *par = item(parent);
    while (count > 0) {
        QTreeWidgetItem *item = new QTreeWidgetItem();
        item->view = view();
        item->par = par;
        if (par)
            par->children.insert(row++, item);
        else
            rootItem->children.insert(row++, item);
        --count;
    }
    endInsertRows();
    return true;
}